

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextobject.cpp
# Opt level: O2

void __thiscall QTextFramePrivate::remove_me(QTextFramePrivate *this)

{
  QTextFrame *pQVar1;
  parameter_type t;
  qsizetype qVar2;
  ulong uVar3;
  long lVar4;
  long in_FS_OFFSET;
  QTextFrame *q;
  QTextObject *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_40 = *(QTextObject **)&(this->super_QTextObjectPrivate).field_0x8;
  pQVar1 = this->parentFrame;
  if (pQVar1 == (QTextFrame *)0x0 &&
      (this->fragment_end == 0 && *(int *)&(this->super_QTextObjectPrivate).field_0x84 == 0)) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      QTextDocumentPrivate::deleteObject
                (*(QTextDocumentPrivate **)(*(long *)(*(long *)&local_40->field_0x8 + 0x10) + 8),
                 local_40);
      return;
    }
  }
  else {
    if (pQVar1 != (QTextFrame *)0x0) {
      qVar2 = QtPrivate::indexOf<QTextFrame*,QTextFrame*>
                        ((QList<QTextFrame_*> *)
                         (*(long *)&(pQVar1->super_QTextObject).field_0x8 + 0x98),
                         (QTextFrame **)&local_40,0);
      lVar4 = qVar2 << 0x20;
      for (uVar3 = 0; uVar3 < (ulong)(this->childFrames).d.size; uVar3 = uVar3 + 1) {
        t = (this->childFrames).d.ptr[uVar3];
        QList<QTextFrame_*>::insert
                  ((QList<QTextFrame_*> *)
                   (*(long *)&(this->parentFrame->super_QTextObject).field_0x8 + 0x98),
                   (long)(int)qVar2 + uVar3,t);
        *(QTextFrame **)(*(long *)&(t->super_QTextObject).field_0x8 + 0x90) = this->parentFrame;
        lVar4 = lVar4 + 0x100000000;
      }
      QList<QTextFrame_*>::removeAt
                ((QList<QTextFrame_*> *)
                 (*(long *)&(this->parentFrame->super_QTextObject).field_0x8 + 0x98),lVar4 >> 0x20);
      QList<QTextFrame_*>::clear(&this->childFrames);
      this->parentFrame = (QTextFrame *)0x0;
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

void QTextFramePrivate::remove_me()
{
    Q_Q(QTextFrame);
    if (fragment_start == 0 && fragment_end == 0
        && !parentFrame) {
        QTextDocumentPrivate::get(q->document())->deleteObject(q);
        return;
    }

    if (!parentFrame)
        return;

    int index = parentFrame->d_func()->childFrames.indexOf(q);

    // iterator over all children and move them to the parent
    for (int i = 0; i < childFrames.size(); ++i) {
        QTextFrame *c = childFrames.at(i);
        parentFrame->d_func()->childFrames.insert(index, c);
        c->d_func()->parentFrame = parentFrame;
        ++index;
    }
    Q_ASSERT(parentFrame->d_func()->childFrames.at(index) == q);
    parentFrame->d_func()->childFrames.removeAt(index);

    childFrames.clear();
    parentFrame = nullptr;
}